

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

bool cmState::IsCacheEntryType(string *key)

{
  bool bVar1;
  int local_1c;
  int i;
  string *key_local;
  
  local_1c = 0;
  while( true ) {
    if (cmCacheEntryTypes[local_1c] == (char *)0x0) {
      return false;
    }
    bVar1 = std::operator==(key,cmCacheEntryTypes[local_1c]);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool cmState::IsCacheEntryType(std::string const& key)
{
  for (int i = 0; cmCacheEntryTypes[i]; ++i) {
    if (key == cmCacheEntryTypes[i]) {
      return true;
    }
  }
  return false;
}